

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_unpack_hdu(fitsfile *infptr,fitsfile *outfptr,fpstate fpvar,int *status)

{
  int iVar1;
  int *in_RDX;
  fitsfile *in_RSI;
  fitsfile *in_RDI;
  int lval;
  int hdutype;
  int *in_stack_0000d578;
  fitsfile *in_stack_0000d580;
  fitsfile *in_stack_0000d588;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int morekeys;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*in_RDX < 1) {
    ffghdt(in_RSI,in_RDX,(int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    morekeys = (int)((ulong)in_RSI >> 0x20);
    if (in_stack_ffffffffffffffdc == 2) {
      ffgky(infptr,outfptr._4_4_,(char *)status,_lval,
            (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
            &in_RDI->HDUposition);
      if ((*in_RDX == 0) && (in_stack_ffffffffffffffd8 != 0)) {
        fits_uncompress_table(in_stack_0000d588,in_stack_0000d580,in_stack_0000d578);
      }
      else {
        if (*in_RDX == 0xca) {
          *in_RDX = 0;
        }
        ffcopy((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
               morekeys,in_RDX);
      }
    }
    else {
      iVar1 = fits_is_compressed_image
                        ((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         (int *)0x10b6a9);
      if (iVar1 == 0) {
        ffcopy((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
               morekeys,in_RDX);
      }
      else {
        fits_img_decompress((fitsfile *)fpvar.prefix._4_8_,(fitsfile *)fpvar._136_8_,
                            (int *)fpvar._128_8_);
      }
    }
  }
  return 0;
}

Assistant:

int fp_unpack_hdu (fitsfile *infptr, fitsfile *outfptr, fpstate fpvar, int *status)
{
	int hdutype, lval;

        if (*status > 0) return(0);

	fits_get_hdu_type (infptr, &hdutype, status);

        /* =============================================================== */
        /* This block is only for beta testing of binary table compression */
	if (hdutype == BINARY_TBL) { 

	    fits_read_key(infptr, TLOGICAL, "ZTABLE", &lval, NULL, status);
	    
	    if (*status == 0 && lval != 0) {
	        /*  uncompress the table */
	        fits_uncompress_table (infptr, outfptr, status);
	    } else {
	        if (*status == KEY_NO_EXIST)  /* table is not compressed */
		    *status = 0;
                fits_copy_hdu (infptr, outfptr, 0, status);
            }

	    return(0);
        /* =============================================================== */

	} else if (fits_is_compressed_image (infptr,  status)) {
            /* uncompress the compressed image HDU */
            fits_img_decompress (infptr, outfptr, status);
        } else {
            /* not a compressed image HDU, so just copy it to the output */
            fits_copy_hdu (infptr, outfptr, 0, status);
        }

	return(0);
}